

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_widgets.cpp
# Opt level: O1

bool correctActionContext(ShortcutContext context,QAction *a,QWidget *active_window)

{
  long lVar1;
  QWidget *pQVar2;
  char cVar3;
  bool bVar4;
  QMenu *this;
  QAction *a_00;
  QGraphicsWidget *w;
  QWidget *w_00;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (active_window == (QWidget *)0x0) {
    bVar6 = false;
  }
  else {
    QAction::associatedObjects();
    bVar6 = true;
    lVar5 = 0;
    do {
      pQVar2 = *(QWidget **)(&DAT_aaaaaaaaaaaaaaaa + lVar5);
      this = (QMenu *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
      if (this == (QMenu *)0x0) {
        if (pQVar2 == (QWidget *)0x0) {
          w_00 = (QWidget *)0x0;
        }
        else {
          w_00 = (QWidget *)0x0;
          if ((*(byte *)(*(long *)&pQVar2->field_0x8 + 0x30) & 1) != 0) {
            w_00 = pQVar2;
          }
        }
        if (w_00 == (QWidget *)0x0) {
          w = (QGraphicsWidget *)QMetaObject::cast((QObject *)&QGraphicsWidget::staticMetaObject);
          if (w == (QGraphicsWidget *)0x0) goto LAB_003a4903;
          bVar4 = correctGraphicsWidgetContext(context,w,active_window);
        }
        else {
          bVar4 = correctWidgetContext(context,w_00,active_window);
        }
LAB_003a48ff:
        if (bVar4 != false) break;
      }
      else {
        a_00 = QMenu::menuAction(this);
        cVar3 = QAction::isVisible();
        if ((cVar3 != '\0') && (cVar3 = QAction::isEnabled(), cVar3 != '\0')) {
          bVar4 = correctActionContext(context,a_00,active_window);
          goto LAB_003a48ff;
        }
      }
LAB_003a4903:
      lVar5 = lVar5 + 8;
      bVar6 = lVar5 != 0x5555555555555550;
    } while (bVar6);
    LOCK();
    _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
    UNLOCK();
    if (_DAT_aaaaaaaaaaaaaaaa == 0) {
      QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

static bool correctActionContext(Qt::ShortcutContext context, QAction *a, QWidget *active_window)
{
    if (!active_window)
        return false;

    const QObjectList associatedObjects = a->associatedObjects();
#if defined(DEBUG_QSHORTCUTMAP)
    if (associatedObjects.isEmpty())
        qDebug() << a << "not connected to any widgets; won't trigger";
#endif
    for (auto object : associatedObjects) {
#if QT_CONFIG(menu)
        if (auto menu = qobject_cast<QMenu *>(object)) {
#ifdef Q_OS_DARWIN
            // On Mac, menu item shortcuts are processed before reaching any window.
            // That means that if a menu action shortcut has not been already processed
            // (and reaches this point), then the menu item itself has been disabled.
            // This occurs at the QPA level on Mac, where we disable all the Cocoa menus
            // when showing a modal window. (Notice that only the QPA menu is disabled,
            // not the QMenu.) Since we can also reach this code by climbing the menu
            // hierarchy (see below), or when the shortcut is not a key-equivalent, we
            // need to check whether the QPA menu is actually disabled.
            // When there is no QPA menu, there will be no QCocoaMenuDelegate checking
            // for the actual shortcuts. We can then fallback to our own logic.
            QPlatformMenu *pm = menu->platformMenu();
            if (pm && !pm->isEnabled())
                continue;
#endif
            QAction *a = menu->menuAction();
            if (a->isVisible() && a->isEnabled() && correctActionContext(context, a, active_window))
                return true;
        } else
#endif
        if (auto widget = qobject_cast<QWidget*>(object)) {
            if (correctWidgetContext(context, widget, active_window))
                return true;
        }
#if QT_CONFIG(graphicsview)
        else if (auto graphicsWidget = qobject_cast<QGraphicsWidget*>(object)) {
            if (correctGraphicsWidgetContext(context, graphicsWidget, active_window))
                return true;
        }
#endif
    }

    return false;
}